

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O1

int nghttp2_stream_detach_item(nghttp2_stream *stream)

{
  byte bVar1;
  int iVar2;
  
  stream->item = (nghttp2_outbound_item *)0x0;
  bVar1 = stream->flags;
  stream->flags = bVar1 & 0xf3;
  if (((bVar1 & 0x10) == 0) && (iVar2 = nghttp2_pq_empty(&stream->obq), iVar2 != 0)) {
    stream_obq_remove(stream);
  }
  return 0;
}

Assistant:

int nghttp2_stream_detach_item(nghttp2_stream *stream) {
  DEBUGF("stream: stream=%d detach item=%p\n", stream->stream_id, stream->item);

  stream->item = NULL;
  stream->flags = (uint8_t)(stream->flags & ~NGHTTP2_STREAM_FLAG_DEFERRED_ALL);

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return 0;
  }

  return stream_update_dep_on_detach_item(stream);
}